

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

void MIR_load_module(MIR_context_t ctx,MIR_module_t_conflict m)

{
  VARR_MIR_module_t *pVVar1;
  MIR_label_t item_00;
  bool bVar2;
  MIR_item_t *ppMVar3;
  int iVar4;
  MIR_item_t_conflict item;
  MIR_insn_t_conflict pMVar5;
  MIR_insn_t_conflict item_01;
  MIR_item_t pMVar6;
  MIR_module_t_conflict *__ptr;
  char *pcVar7;
  size_t sVar8;
  MIR_item_t pMVar9;
  MIR_context_t pMVar10;
  char *pcVar11;
  char *pcVar12;
  MIR_item_t pMVar13;
  MIR_insn_t_conflict pMVar14;
  ulong uVar15;
  MIR_data_t pMVar16;
  MIR_bss_t pMVar17;
  MIR_lref_data_t pMVar18;
  MIR_func_t pMVar19;
  MIR_ref_data_t pMVar20;
  int extraout_EDX;
  MIR_error_type_t MVar21;
  MIR_context_t ctx_00;
  long lVar22;
  MIR_context_t ctx_01;
  size_t sVar23;
  
  if (m == (MIR_module_t_conflict)0x0) {
LAB_0013364d:
    __assert_fail("m != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x765,"void MIR_load_module(MIR_context_t, MIR_module_t)");
  }
  pMVar14 = (MIR_insn_t_conflict)(m->items).head;
  item_01 = (MIR_insn_t_conflict)m;
  ctx_00 = ctx;
  if (pMVar14 != (MIR_insn_t_conflict)0x0) {
    bVar2 = false;
    do {
      iVar4 = *(int *)&pMVar14->ops[0].data;
      if (iVar4 - 5U < 5) {
        if (iVar4 == 7) {
          bVar2 = true;
        }
        item_01 = pMVar14;
        ctx_00 = ctx;
        pMVar5 = (MIR_insn_t_conflict)load_bss_data_section(ctx,(MIR_item_t_conflict)pMVar14,0);
      }
      else {
        pMVar5 = pMVar14;
        if (iVar4 == 0) {
          item_01 = (MIR_insn_t_conflict)pMVar14->ops[0].u.ref;
          if (item_01 == (MIR_insn_t_conflict)0x0) {
            item_01 = (MIR_insn_t_conflict)_MIR_publish_code(ctx,short_jmp_pattern,0xd);
            pMVar14->ops[0].u.ref = (MIR_item_t)item_01;
          }
          ctx_00 = ctx;
          _MIR_redirect_thunk(ctx,item_01,undefined_interface);
        }
      }
      if (*(undefined1 *)((long)&pMVar14->ops[0].u + 8) != '\0') {
        if (*(int *)&pMVar14->ops[0].data - 2U < 3) {
          __assert_fail("first_item->item_type != MIR_export_item && first_item->item_type != MIR_import_item && first_item->item_type != MIR_forward_item"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x77b,"void MIR_load_module(MIR_context_t, MIR_module_t)");
        }
        item_01 = (MIR_insn_t_conflict)MIR_item_name(ctx_00,(MIR_item_t_conflict)pMVar14);
        ctx_00 = ctx;
        iVar4 = setup_global(ctx,(char *)item_01,pMVar14->ops[0].u.ref,(MIR_item_t_conflict)pMVar14)
        ;
        if (((iVar4 != 0) && (*(MIR_item_type_t *)&pMVar5->ops[0].data == MIR_func_item)) &&
           (ctx->func_redef_permission_p == 0)) {
          pcVar12 = "func %s is prohibited for redefinition";
          MVar21 = MIR_repeated_decl_error;
          pcVar11 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar5->ops[0].u + 0x10))->func->name
          ;
          goto LAB_00133647;
        }
      }
      pMVar14 = *(MIR_insn_t_conflict *)&pMVar5->field_0x18;
    } while (pMVar14 != (MIR_insn_t_conflict)0x0);
    if ((bVar2) && (pMVar6 = (m->items).head, pMVar9 = pMVar6, pMVar6 != (MIR_item_t_conflict)0x0))
    {
      do {
        if (pMVar9->item_type == MIR_func_item) {
          pMVar19 = (pMVar9->u).func;
          for (item_01 = (pMVar19->insns).head; item_01 != (MIR_insn_t_conflict)0x0;
              item_01 = (MIR_insn_t_conflict)
                        ((DLIST_LINK_MIR_item_t *)&(item_01->insn_link).next)->prev) {
            if (*(int *)&item_01->field_0x18 == 0xb4) {
              item_01->data = pMVar19;
            }
          }
        }
        pMVar9 = (pMVar9->item_link).next;
        pMVar13 = pMVar6;
      } while (pMVar9 != (MIR_item_t)0x0);
      do {
        if (pMVar13->item_type == MIR_lref_data_item) {
          pMVar19 = (pMVar13->u).func;
          item_01 = (MIR_insn_t_conflict)pMVar19->func_item->data;
          if (item_01 == (MIR_insn_t_conflict)0x0) {
            pcVar7 = pMVar19->name;
            pcVar12 = "A label not from any function in lref %s";
          }
          else {
            if (((long *)pMVar19->original_vars_num == (long *)0x0) ||
               (*(MIR_insn_t_conflict *)pMVar19->original_vars_num == item_01)) {
              ctx_00 = *(MIR_context_t *)(item_01->ops + 2);
              *(MIR_context_t *)&pMVar19->nres = ctx_00;
              *(MIR_func_t *)(item_01->ops + 2) = pMVar19;
              goto LAB_00133547;
            }
            pcVar7 = pMVar19->name;
            pcVar12 = "Labels from different functions in lref %s";
          }
          pcVar11 = "";
          if (pcVar7 != (char *)0x0) {
            pcVar11 = pcVar7;
          }
          MVar21 = MIR_wrong_lref_error;
LAB_00133647:
          (*ctx->error_func)(MVar21,pcVar12,pcVar11);
          goto LAB_0013364d;
        }
LAB_00133547:
        pMVar13 = (pMVar13->item_link).next;
      } while (pMVar13 != (MIR_item_t)0x0);
      do {
        if (pMVar6->item_type == MIR_func_item) {
          for (pMVar14 = (((pMVar6->u).func)->insns).head; pMVar14 != (MIR_insn_t_conflict)0x0;
              pMVar14 = (pMVar14->insn_link).next) {
            if (*(int *)&pMVar14->field_0x18 == 0xb4) {
              pMVar14->data = (void *)0x0;
            }
          }
        }
        pMVar6 = (pMVar6->item_link).next;
      } while (pMVar6 != (MIR_item_t)0x0);
    }
  }
  pVVar1 = ctx->modules_to_link;
  __ptr = pVVar1->varr;
  if (__ptr != (MIR_module_t_conflict *)0x0) {
    sVar23 = pVVar1->els_num;
    uVar15 = sVar23 + 1;
    if (pVVar1->size < uVar15) {
      sVar23 = (uVar15 >> 1) + uVar15;
      __ptr = (MIR_module_t_conflict *)realloc(__ptr,sVar23 * 8);
      pVVar1->varr = __ptr;
      pVVar1->size = sVar23;
      sVar23 = pVVar1->els_num;
      uVar15 = sVar23 + 1;
    }
    pVVar1->els_num = uVar15;
    __ptr[sVar23] = m;
    return;
  }
  MIR_load_module_cold_1();
  pMVar10 = (MIR_context_t)item_01->ops[0].u.ref;
  pMVar14 = item_01;
  ctx_01 = ctx_00;
  if (pMVar10 == (MIR_context_t)0x0) {
    lVar22 = 0;
    pMVar10 = ctx_00;
    pMVar5 = item_01;
    while ((void *)pMVar5->ops[0].u.i == (void *)0x0) {
      switch(*(MIR_item_type_t *)&pMVar5->ops[0].data) {
      case MIR_data_item:
        pMVar16 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar5->ops[0].u + 0x10))->data;
        if ((pMVar5 != item_01) && (pMVar16->name != (char *)0x0)) goto switchD_001336c5_default;
        sVar23 = pMVar16->nel;
        sVar8 = _MIR_type_size(pMVar10,pMVar16->el_type);
        pMVar9 = (MIR_item_t)(sVar8 * sVar23);
        break;
      case MIR_ref_data_item:
      case MIR_lref_data_item:
        pMVar9 = (MIR_item_t)0x8;
        if ((pMVar5 != item_01) &&
           (((anon_union_8_10_166bea1d_for_u *)((long)&pMVar5->ops[0].u + 0x10))->func->name !=
            (char *)0x0)) goto switchD_001336c5_default;
        break;
      case MIR_expr_data_item:
        pMVar18 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar5->ops[0].u + 0x10))->lref_data;
        if ((pMVar5 != item_01) && (pMVar18->name != (char *)0x0)) goto switchD_001336c5_default;
        item_00 = pMVar18->label;
        if ((*(MIR_item_type_t *)&item_00->ops[0].data != MIR_func_item) ||
           ((pMVar19 = ((anon_union_8_10_166bea1d_for_u *)((long)&item_00->ops[0].u + 0x10))->func,
            pMVar19->expr_p == '\0' || (pMVar19->nres != 1)))) {
          item_01 = (MIR_insn_t_conflict)ctx_00->error_func;
          pcVar11 = MIR_item_name(pMVar10,(MIR_item_t_conflict)item_00);
          ctx_01 = (MIR_context_t)&DAT_00000002;
          (*(code *)item_01)(2,
                             "%s can not be an expr which should be a func w/o calls and memory ops"
                             ,pcVar11);
          goto LAB_0013393e;
        }
        pMVar9 = (MIR_item_t)_MIR_type_size(pMVar10,*pMVar19->res_types);
        break;
      case MIR_bss_item:
        pMVar19 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar5->ops[0].u + 0x10))->func;
        if ((pMVar5 != item_01) && (pMVar19->name != (char *)0x0)) goto switchD_001336c5_default;
        pMVar9 = pMVar19->func_item;
        break;
      default:
        goto switchD_001336c5_default;
      }
      lVar22 = (long)&pMVar9->data + lVar22;
      if ((extraout_EDX != 0) ||
         (pMVar5 = *(MIR_insn_t_conflict *)&pMVar5->field_0x18, pMVar5 == (MIR_insn_t_conflict)0x0))
      break;
    }
switchD_001336c5_default:
    ctx_01 = (MIR_context_t)(lVar22 + 7U & 0xfffffffffffffff8);
    pMVar10 = (MIR_context_t)malloc((size_t)ctx_01);
    item_01->ops[0].u.ref = (MIR_item_t)pMVar10;
    if (pMVar10 == (MIR_context_t)0x0) {
LAB_0013393e:
      pcVar12 = MIR_item_name(ctx_01,(MIR_item_t_conflict)item_01);
      pMVar10 = (MIR_context_t)0x3;
      pcVar11 = "";
      if (pcVar12 != (char *)0x0) {
        pcVar11 = pcVar12;
      }
      (*ctx_00->error_func)(MIR_alloc_error,"Not enough memory to allocate data/bss %s",pcVar11);
      _MIR_publish_code(pMVar10,short_jmp_pattern,0xd);
      return;
    }
    *(char *)((long)&item_01->ops[0].u + 9) = '\x01';
  }
  do {
    if (pMVar14 == item_01) {
      switch(*(MIR_item_type_t *)&pMVar14->ops[0].data) {
      case MIR_data_item:
        pMVar16 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))->data;
LAB_00133809:
        sVar23 = pMVar16->nel;
        sVar8 = _MIR_type_size(ctx_01,pMVar16->el_type);
        pMVar9 = (MIR_item_t)(sVar8 * sVar23);
        ctx_01 = pMVar10;
        memmove(pMVar10,&(((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))->
                          func->insns).tail,(size_t)pMVar9);
LAB_001338d6:
        pMVar14->ops[0].u.ref = (MIR_item_t)pMVar10;
        break;
      case MIR_ref_data_item:
        pMVar20 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))->ref_data;
        goto LAB_001338e2;
      case MIR_lref_data_item:
        pMVar18 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))->lref_data;
        goto LAB_001338ac;
      case MIR_expr_data_item:
        pMVar19 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))->func;
        goto LAB_001338b7;
      case MIR_bss_item:
        pMVar17 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))->bss;
        goto LAB_00133889;
      default:
        goto switchD_001337d7_default;
      }
    }
    else {
      if ((void *)pMVar14->ops[0].u.i != (void *)0x0) {
        return;
      }
      switch(*(MIR_item_type_t *)&pMVar14->ops[0].data) {
      case MIR_data_item:
        pMVar16 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))->data;
        if (pMVar16->name != (char *)0x0) {
          return;
        }
        goto LAB_00133809;
      case MIR_ref_data_item:
        pMVar20 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))->ref_data;
        if (pMVar20->name != (char *)0x0) {
          return;
        }
LAB_001338e2:
        pMVar20->load_addr = pMVar10;
        break;
      case MIR_lref_data_item:
        pMVar18 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))->lref_data;
        if (pMVar18->name != (char *)0x0) {
          return;
        }
LAB_001338ac:
        pMVar18->load_addr = pMVar10;
        break;
      case MIR_expr_data_item:
        pMVar19 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))->func;
        if (pMVar19->name != (char *)0x0) {
          return;
        }
LAB_001338b7:
        pMVar9 = (MIR_item_t)_MIR_type_size(ctx_01,*((pMVar19->func_item->u).func)->res_types);
        ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))->expr_data->load_addr
             = pMVar10;
        goto LAB_001338d6;
      case MIR_bss_item:
        pMVar17 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))->bss;
        if (pMVar17->name == (char *)0x0) {
LAB_00133889:
          ctx_01 = pMVar10;
          memset(pMVar10,0,pMVar17->len);
          pMVar14->ops[0].u.ref = (MIR_item_t)pMVar10;
          pMVar9 = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar14->ops[0].u + 0x10))->func->
                   func_item;
          goto LAB_001338f1;
        }
      default:
        goto switchD_001337d7_default;
      }
      pMVar14->ops[0].u.ref = (MIR_item_t)pMVar10;
      pMVar9 = (MIR_item_t)0x8;
    }
LAB_001338f1:
    if (extraout_EDX != 0) {
      return;
    }
    ppMVar3 = (MIR_item_t *)&pMVar14->field_0x18;
    pMVar10 = (MIR_context_t)((long)&pMVar9->data + (long)&pMVar10->gen_ctx);
    pMVar14 = (MIR_insn_t_conflict)*ppMVar3;
  } while ((MIR_insn_t_conflict)*ppMVar3 != (MIR_insn_t_conflict)0x0);
switchD_001337d7_default:
  return;
}

Assistant:

void MIR_load_module (MIR_context_t ctx, MIR_module_t m) {
  int lref_p = FALSE;
  mir_assert (m != NULL);
  for (MIR_item_t item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
       item = DLIST_NEXT (MIR_item_t, item)) {
    MIR_item_t first_item = item;

    if (item->item_type == MIR_bss_item || item->item_type == MIR_data_item
        || item->item_type == MIR_ref_data_item || item->item_type == MIR_lref_data_item
        || item->item_type == MIR_expr_data_item) {
      if (item->item_type == MIR_lref_data_item) lref_p = TRUE;
      item = load_bss_data_section (ctx, item, FALSE);
    } else if (item->item_type == MIR_func_item) {
      if (item->addr == NULL) {
        item->addr = _MIR_get_thunk (ctx);
#if defined(MIR_DEBUG)
        fprintf (stderr, "%016llx: %s\n", (unsigned long long) item->addr, item->u.func->name);
#endif
      }
      _MIR_redirect_thunk (ctx, item->addr, undefined_interface);
    }
    if (first_item->export_p) { /* update global item table */
      mir_assert (first_item->item_type != MIR_export_item
                  && first_item->item_type != MIR_import_item
                  && first_item->item_type != MIR_forward_item);
      if (setup_global (ctx, MIR_item_name (ctx, first_item), first_item->addr, first_item)
          && item->item_type == MIR_func_item
          && !func_redef_permission_p
#ifdef __APPLE__
          /* macosx can have multiple equal external inline definitions of the same function: */
          && strncmp (item->u.func->name, "__darwin", 8) != 0
#endif
      )
        MIR_get_error_func (ctx) (MIR_repeated_decl_error, "func %s is prohibited for redefinition",
                                  item->u.func->name);
    }
  }
  if (lref_p) link_module_lrefs (ctx, m);
  VARR_PUSH (MIR_module_t, modules_to_link, m);
}